

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

out_of_range * __thiscall
nlohmann::detail::out_of_range::
create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (out_of_range *__return_storage_ptr__,out_of_range *this,int id_,string *what_arg,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *context)

{
  char *what_arg_00;
  exception local_e0;
  allocator local_a9;
  string local_a8 [32];
  exception local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string w;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *context_local;
  string *what_arg_local;
  int id__local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"out_of_range",&local_a9);
  exception::name(&local_88,(string *)local_a8,(int)this);
  exception::
  diagnostics<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_e0,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)what_arg);
  std::operator+(local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_88);
  std::operator+(local_48,local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  what_arg_00 = (char *)std::__cxx11::string::c_str();
  out_of_range(__return_storage_ptr__,(int)this,what_arg_00);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static out_of_range create(int id_, const std::string& what_arg, const BasicJsonType& context)
    {
        std::string w = exception::name("out_of_range", id_) + exception::diagnostics(context) + what_arg;
        return out_of_range(id_, w.c_str());
    }